

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::ClearSolution(LpSolver *this)

{
  pointer piVar1;
  
  std::__uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::reset
            ((__uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)&this->iterate_,
             (pointer)0x0);
  std::__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_> *)&this->basis_,
             (pointer)0x0);
  std::valarray<double>::resize(&this->x_crossover_,0,0.0);
  std::valarray<double>::resize(&this->y_crossover_,0,0.0);
  std::valarray<double>::resize(&this->z_crossover_,0,0.0);
  std::valarray<double>::resize(&this->crossover_weights_,0,0.0);
  piVar1 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(&this->basic_statuses_);
  memset(&this->info_,0,0x1d0);
  Model::GetInfo(&this->model_,&this->info_);
  return;
}

Assistant:

void LpSolver::ClearSolution() {
    iterate_.reset(nullptr);
    basis_.reset(nullptr);
    x_crossover_.resize(0);
    y_crossover_.resize(0);
    z_crossover_.resize(0);
    crossover_weights_.resize(0);
    basic_statuses_.clear();
    basic_statuses_.shrink_to_fit();
    info_ = Info();
    // Restore info entries that belong to model.
    model_.GetInfo(&info_);

}